

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_lookup.cc
# Opt level: O0

time_zone absl::lts_20250127::time_internal::cctz::fixed_time_zone(seconds *offset)

{
  seconds *offset_00;
  string local_38;
  cctz *local_18;
  seconds *offset_local;
  time_zone tz;
  
  local_18 = (cctz *)offset;
  time_zone::time_zone((time_zone *)&offset_local);
  FixedOffsetToName_abi_cxx11_(&local_38,local_18,offset_00);
  load_time_zone(&local_38,(time_zone *)&offset_local);
  std::__cxx11::string::~string((string *)&local_38);
  return (time_zone)(Impl *)offset_local;
}

Assistant:

time_zone fixed_time_zone(const seconds& offset) {
  time_zone tz;
  load_time_zone(FixedOffsetToName(offset), &tz);
  return tz;
}